

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O1

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::Print
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this,char *name,ostream *out,
          MatrixOutputFormat form)

{
  char cVar1;
  size_t sVar2;
  long *plVar3;
  _List_node_base *p_Var4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "virtual void TPZDohrMatrix<double, TPZDohrSubstructCondense<double>>::Print(const char *, std::ostream &, const MatrixOutputFormat) const [TVar = double, TSubStruct = TPZDohrSubstructCondense<double>]"
             ,200);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (name == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of coarse equations ",0x1b);
  plVar3 = (long *)std::ostream::operator<<(out,this->fNumCoarse);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  for (p_Var4 = (this->fGlobal).
                super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&this->fGlobal; p_Var4 = p_Var4->_M_next) {
    TPZDohrSubstructCondense<double>::Print
              ((TPZDohrSubstructCondense<double> *)(p_Var4[1]._M_next)->_M_next,out);
  }
  return;
}

Assistant:

void Print(const char *name, std::ostream& out,const MatrixOutputFormat form = EFormatted) const override
	{
		out << __PRETTY_FUNCTION__ << std::endl;
		out << name << std::endl;
		out << "Number of coarse equations " << fNumCoarse << std::endl;
		typename SubsList::const_iterator iter;
		for (iter=fGlobal.begin();iter!=fGlobal.end();iter++) {
			(*iter)->Print(out);
		}
	}